

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  float fVar1;
  int iVar2;
  ImGuiDockNode *pIVar3;
  ImDrawList *draw_list;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *ctx;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  short sVar11;
  ImU32 id;
  int iVar12;
  uint uVar13;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar14;
  size_t sVar15;
  ImGuiWindow *extraout_RAX;
  undefined7 uVar18;
  char *pcVar17;
  uint flags_00;
  int iVar19;
  int iVar20;
  ImGuiCol idx;
  uint uVar21;
  undefined1 uVar22;
  float fVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar24;
  ImVec2 IVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float local_dc;
  bool text_clipped;
  bool just_closed;
  ImGuiWindow *local_c8;
  uint local_bc;
  int local_b8;
  ImU32 local_b4;
  bool held;
  float local_ac;
  undefined1 local_a8 [8];
  ulong uStack_a0;
  ImGuiWindow *local_98;
  ImVec2 local_90;
  bool hovered;
  undefined7 uStack_87;
  float fStack_84;
  bool *local_80;
  char *local_78;
  ImGuiTabItem *local_70;
  ImRect bb;
  ImGuiWindow *pIVar16;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  pIVar16 = GImGui->CurrentWindow;
  if (pIVar16->SkipItems != false) {
    return false;
  }
  local_c8 = docked_window;
  id = TabBarCalcTabID(tab_bar,label,docked_window);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      PushItemFlag(0x18,true);
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,id,(ImRect *)0x0);
      PopItemFlag();
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x1da8,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
  }
  local_98 = pIVar16;
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1da9,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  local_80 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_80 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar24 = TabItemCalcSize(label,local_80 != (bool *)0x0);
  unique0x100001d7 = extraout_XMM0_Dc;
  local_a8._0_4_ = IVar24.x;
  local_a8._4_4_ = IVar24.y;
  unique0x100001db = extraout_XMM0_Dd;
  pIVar14 = TabBarFindTabByID(tab_bar,id);
  local_90 = (ImVec2)pIVar14;
  local_78 = label;
  if (pIVar14 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar14 = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
    pIVar14->ID = id;
    pIVar14->Width = (float)local_a8._0_4_;
    tab_bar->TabsAddedNew = true;
  }
  iVar12 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar14);
  pcVar7 = local_78;
  tab_bar->LastTabItemIdx = (ImS16)iVar12;
  pIVar14->ContentWidth = (float)local_a8._0_4_;
  sVar11 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar11 + 1;
  pIVar14->BeginOrder = sVar11;
  uVar21 = tab_bar->Flags;
  iVar12 = tab_bar->PrevFrameVisible;
  iVar19 = ctx->FrameCount;
  iVar20 = pIVar14->LastFrameVisible;
  pIVar14->LastFrameVisible = iVar19;
  pIVar14->Flags = flags_00;
  pIVar14->Window = local_c8;
  if (local_c8 == (ImGuiWindow *)0x0) {
    iVar2 = (tab_bar->TabsNames).Buf.Size;
    sVar11 = (short)iVar2 + -1;
    if (iVar2 == 0) {
      sVar11 = 0;
    }
    pIVar14->NameOffset = sVar11;
    local_bc = uVar21;
    local_b8 = iVar19;
    local_b4 = id;
    sVar15 = strlen(local_78);
    id = local_b4;
    ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar7,pcVar7 + sVar15 + 1);
    pIVar16 = extraout_RAX;
    uVar21 = local_bc;
    iVar19 = local_b8;
    fVar1 = (float)local_a8._4_4_;
  }
  else {
    if ((uVar21 >> 0x14 & 1) == 0) {
      __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x1dd0,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    pIVar14->NameOffset = -1;
    pIVar16 = local_c8;
    fVar1 = (float)local_a8._4_4_;
  }
  uVar6 = uStack_a0;
  iVar12 = iVar12 + 1;
  iVar20 = iVar20 + 1;
  if (((iVar20 < iVar19) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar12 < iVar19) {
      uVar13 = flags_00 & 0x200000 | tab_bar->SelectedTabId;
      pIVar16 = (ImGuiWindow *)(ulong)uVar13;
    }
    else {
      uVar13 = flags_00 >> 0x15 & 1;
    }
    if (uVar13 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) &&
     (pIVar16 = (ImGuiWindow *)(ulong)(flags_00 & 0x200000), (flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar18 = (undefined7)((ulong)pIVar16 >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_a8 = (undefined1  [8])CONCAT71(uVar18,1);
LAB_00161257:
    _local_a8 = CONCAT88(uVar6,local_a8);
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uStack_a0;
    _local_a8 = auVar4 << 0x40;
    if (((tab_bar->SelectedTabId == 0) && (local_c8 == (ImGuiWindow *)0x0)) && (iVar12 < iVar19)) {
      if ((tab_bar->Tabs).Size == 1) {
        local_a8 = (undefined1  [8])CONCAT71(uVar18,(tab_bar->Flags & 2) == 0);
        goto LAB_00161257;
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar6;
      _local_a8 = auVar5 << 0x40;
    }
  }
  if ((iVar20 < iVar19) && (local_90 == (ImVec2)0x0 || iVar19 <= iVar12)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((flags_00 >> 0x15 & 1) == 0 & local_a8[0]);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar14->LastFrameSelected = ctx->FrameCount;
  }
  uVar13 = pIVar14->Flags;
  fVar26 = pIVar14->Width;
  fVar23 = pIVar14->Offset;
  if ((uVar13 & 0xc0) == 0) {
    fVar23 = (float)(int)(fVar23 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar23 + (tab_bar->BarRect).Min.x;
  local_90 = (local_98->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar24.y = bb.Min.y;
  IVar24.x = bb.Min.x;
  (local_98->DC).CursorPos = IVar24;
  bb.Max.x = fVar26 + bb.Min.x;
  bb.Max.y = fVar1 + bb.Min.y;
  local_bc = uVar21;
  local_b8 = iVar19;
  local_70 = pIVar14;
  if ((uVar13 & 0xc0) == 0) {
    fVar1 = tab_bar->ScrollingRectMinX;
    if ((fVar1 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_0016135c;
    fStack_84 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar1 <= bb.Min.x) & (uint)fVar1 |
                      (uint)bb.Min.x & -(uint)(fVar1 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_ac = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    bVar10 = true;
  }
  else {
LAB_0016135c:
    bVar10 = false;
  }
  pIVar16 = local_98;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_84 = bb.Max.y - bb.Min.y;
  IVar24 = (local_98->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(ctx->Style).FramePadding.y);
  (pIVar16->DC).CursorMaxPos = IVar24;
  bVar8 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar8) {
    if (bVar10) {
      PopClipRect();
    }
    (local_98->DC).CursorPos = local_90;
    return (bool)local_a8[0];
  }
  uVar21 = (flags_00 >> 0x11 & 0x10) + 0x1010;
  if (ctx->DragDropActive == true) {
    bVar8 = ImGuiPayload::IsDataType(&ctx->DragDropPayload,"_IMWINDOW");
    if (!bVar8) {
      uVar21 = uVar21 | 0x200;
    }
  }
  bVar8 = ButtonBehavior(&bb,id,&hovered,&held,uVar21);
  pIVar14 = local_70;
  local_b4 = CONCAT31(local_b4._1_3_,bVar8);
  if ((flags_00 >> 0x15 & 1) == 0 && bVar8) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | ctx->HoveredId == id);
  if (((held == true && local_c8 != (ImGuiWindow *)0x0) && (ctx->ActiveId == id)) &&
     (ctx->ActiveIdIsJustActivated == true)) {
    ctx->ActiveIdWindow = local_c8;
  }
  if (held == false) {
    SetItemAllowOverlap();
  }
  iVar12 = local_b8;
  if ((((local_c8 == (ImGuiWindow *)0x0) ||
       (pIVar3 = local_c8->DockNode, pIVar3 == (ImGuiDockNode *)0x0)) ||
      ((pIVar3->ParentNode != (ImGuiDockNode *)0x0 ||
       (((pIVar3->LocalFlags & 0x400U) != 0 || (held != true)))))) || ((pIVar3->Windows).Size != 1))
  {
LAB_00161563:
    if ((((held & 1U) != 0) && (iVar12 <= iVar20)) && (bVar8 = IsMouseDragging(0,-1.0), bVar8)) {
      local_dc = 0.0;
      if (ctx->DragDropActive != false) goto LAB_001615a0;
      uVar21 = tab_bar->Flags;
      if (local_c8 == (ImGuiWindow *)0x0 && (uVar21 & 1) == 0) goto LAB_001617e2;
      fVar1 = (ctx->IO).MouseDelta.x;
      if (0.0 <= fVar1) {
LAB_00161a0a:
        if (0.0 < fVar1) {
          fVar1 = (ctx->IO).MousePos.x;
          if ((bb.Max.x < fVar1) && (local_dc = fVar1 - bb.Max.x, (uVar21 & 1) != 0)) {
            iVar12 = 1;
            goto LAB_00161a52;
          }
        }
      }
      else {
        fVar26 = (ctx->IO).MousePos.x;
        if (bb.Min.x <= fVar26) goto LAB_00161a0a;
        local_dc = bb.Min.x - fVar26;
        if ((uVar21 & 1) == 0) goto LAB_001615a0;
        iVar12 = -1;
LAB_00161a52:
        TabBarQueueReorder(tab_bar,pIVar14,iVar12);
      }
LAB_001615a0:
      if ((local_c8 != (ImGuiWindow *)0x0) && ((local_c8->Flags & 4) == 0)) {
        if ((ctx->DragDropActive != true) || ((ctx->DragDropPayload).SourceId != id)) {
          fVar1 = ctx->FontSize;
          fVar23 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar1 + fVar1)) * 0.2;
          fVar26 = fVar1 * 4.0;
          if (fVar23 <= fVar1 * 4.0) {
            fVar26 = fVar23;
          }
          fVar28 = (ctx->IO).MousePos.y;
          fVar27 = bb.Min.y - fVar28;
          fVar28 = fVar28 - bb.Max.y;
          uVar21 = -(uint)(fVar28 <= fVar27);
          if ((float)(~uVar21 & (uint)fVar28 | (uint)fVar27 & uVar21) <
              fVar1 * 1.5 + (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar26)) {
            if (fVar1 * 2.2 < local_dc) {
              cVar9 = tab_bar->ReorderRequestDir;
              if (cVar9 < '\0') {
                iVar12 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar14);
                if (iVar12 == 0) goto LAB_001616b2;
                cVar9 = tab_bar->ReorderRequestDir;
              }
              if (('\0' < cVar9) &&
                 (iVar12 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar14),
                 iVar12 == (tab_bar->Tabs).Size + -1)) goto LAB_001616b2;
            }
            goto LAB_001617e2;
          }
        }
LAB_001616b2:
        pIVar16 = local_c8;
        DockContextQueueUndockWindow(ctx,local_c8);
        ctx->MovingWindow = pIVar16;
        SetActiveID(pIVar16->MoveId,pIVar16);
        IVar24 = ctx->MovingWindow->Pos;
        IVar25.x = (ctx->ActiveIdClickOffset).x - (IVar24.x - bb.Min.x);
        IVar25.y = (ctx->ActiveIdClickOffset).y - (IVar24.y - bb.Min.y);
        ctx->ActiveIdClickOffset = IVar25;
        ctx->ActiveIdNoClearOnFocusLoss = true;
      }
    }
  }
  else {
    bVar8 = IsMouseDragging(0,0.0);
    if (!bVar8) {
      goto LAB_00161563;
    }
    StartMouseMovingWindow(local_c8);
  }
LAB_001617e2:
  draw_list = local_98->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (local_a8[0] == '\0') {
      idx = (uint)((local_bc >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_bc >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar8 = IsItemHovered(8);
  if (bVar8) {
    bVar8 = IsMouseClicked(1,false);
    if (bVar8) {
      uVar21 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar8 = IsMouseReleased(1);
      if (!bVar8) goto LAB_001618a3;
      uVar21 = flags_00 & 0x200000;
    }
    if (uVar21 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_001618a3:
  uVar21 = tab_bar->Flags;
  if (local_80 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar21 >> 1 & 4 | flags_00,tab_bar->FramePadding,local_78,id,
             close_button_id,(bool)local_a8[0],&just_closed,&text_clipped);
  pIVar14 = local_70;
  if ((local_80 != (bool *)0x0) && (just_closed != false)) {
    *local_80 = false;
    TabBarCloseTab(tab_bar,local_70);
  }
  if (bVar10) {
    PopClipRect();
  }
  (local_98->DC).CursorPos = local_90;
  if (((((text_clipped == true) && (ctx->HoveredId == id)) && (held == false)) &&
      ((0.5 < ctx->HoveredIdNotActiveTimer && (bVar10 = IsItemHovered(0), pcVar7 = local_78, bVar10)
       ))) && (((tab_bar->Flags & 0x20) == 0 && ((pIVar14->Flags & 0x10) == 0)))) {
    pcVar17 = FindRenderedTextEnd(local_78,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar17 - (int)pcVar7),pcVar7);
  }
  uVar22 = local_a8[0];
  if (((flags_00 >> 0x15 & 1) != 0) &&
     (uVar22 = (undefined1)local_b4, tab_bar->SelectedTabId == pIVar14->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1e9c,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  return (bool)uVar22;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label, docked_window);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    // (regular tabs are permitted in a DockNode tab bar, but window tabs not permitted in a non-DockNode tab bar)
    if (tab->Window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                SetActiveID(g.MovingWindow->MoveId, g.MovingWindow);
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
                g.ActiveIdNoClearOnFocusLoss = true;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}